

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O3

void mi_heap_main_init(void)

{
  mi_threadid_t *in_FS_OFFSET;
  
  if (_mi_heap_main.cookie != 0) {
    return;
  }
  _mi_heap_main.thread_id = *in_FS_OFFSET;
  _mi_heap_main.cookie = 1;
  _mi_random_init(&_mi_heap_main.random);
  _mi_heap_main.cookie = _mi_heap_random_next(&_mi_heap_main);
  _mi_heap_main.keys[0] = _mi_heap_random_next(&_mi_heap_main);
  _mi_heap_main.keys[1] = _mi_heap_random_next(&_mi_heap_main);
  pthread_mutex_init((pthread_mutex_t *)&mi_subproc_default.abandoned_os_lock,
                     (pthread_mutexattr_t *)0x0);
  pthread_mutex_init((pthread_mutex_t *)&mi_subproc_default.abandoned_os_visit_lock,
                     (pthread_mutexattr_t *)0x0);
  return;
}

Assistant:

static void mi_heap_main_init(void) {
  if (_mi_heap_main.cookie == 0) {
    _mi_heap_main.thread_id = _mi_thread_id();
    _mi_heap_main.cookie = 1;
    #if defined(_WIN32) && !defined(MI_SHARED_LIB)
      _mi_random_init_weak(&_mi_heap_main.random);    // prevent allocation failure during bcrypt dll initialization with static linking
    #else
      _mi_random_init(&_mi_heap_main.random);
    #endif
    _mi_heap_main.cookie  = _mi_heap_random_next(&_mi_heap_main);
    _mi_heap_main.keys[0] = _mi_heap_random_next(&_mi_heap_main);
    _mi_heap_main.keys[1] = _mi_heap_random_next(&_mi_heap_main);
    mi_lock_init(&mi_subproc_default.abandoned_os_lock);
    mi_lock_init(&mi_subproc_default.abandoned_os_visit_lock);
    _mi_heap_guarded_init(&_mi_heap_main);
  }
}